

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O0

void sc_reduce(limb_t *dst,limb_t *e)

{
  long in_RSI;
  int i;
  limb_t carry;
  lsc_t tmp;
  undefined4 in_stack_ffffffffffffff88;
  int iVar1;
  limb_t *res;
  ulong local_68 [5];
  long local_40;
  ulong auStack_38 [7];
  
  res = (limb_t *)0x0;
  for (iVar1 = 0; local_40 = (long)res >> 0x34, iVar1 < 5; iVar1 = iVar1 + 1) {
    res = (limb_t *)(local_40 + *(long *)(in_RSI + (long)iVar1 * 8));
    local_68[iVar1] = (ulong)res & 0xfffffffffffff;
  }
  for (iVar1 = 6; iVar1 < 10; iVar1 = iVar1 + 1) {
    local_68[iVar1] = 0;
  }
  sc_barrett(res,(limb_t *)CONCAT44(iVar1,in_stack_ffffffffffffff88));
  return;
}

Assistant:

void
sc_reduce(sc_t dst, const sc_t e)
{
	lsc_t tmp;
	limb_t carry;
	int i;

	/* carry e */
	for (carry = 0, i = 0; i < K; i++) {
		carry = (carry >> LB) + e[i];
		tmp[i] = carry & MSK;
	}
	tmp[K] = carry >> LB;
	for (i = K+1; i < 2*K; i++)
		tmp[i] = 0;
	
	/* reduce modulo m */
	sc_barrett(dst, tmp);
}